

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeverityControl.cpp
# Opt level: O2

int f(void)

{
  Session *this;
  atomic<unsigned_long> eventSourceId;
  SessionWriter *pSVar1;
  __atomic_base<unsigned_long> _Var2;
  nanoseconds clock;
  allocator local_e6;
  char local_e5;
  allocator local_e4;
  allocator local_e3;
  allocator local_e2;
  allocator local_e1;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  pSVar1 = binlog::default_thread_local_writer();
  if ((pSVar1->_session->_minSeverity)._M_i < 0x201) {
    if (f::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar1 = binlog::default_thread_local_writer();
      this = pSVar1->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = error;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",&local_e1);
      std::__cxx11::string::string(local_b0,"f",&local_e2);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/SeverityControl.cpp"
                 ,&local_e3);
      local_70 = 0xc;
      std::__cxx11::string::string(local_68,"Unexpected call to f()",&local_e4);
      local_e5 = '\0';
      std::__cxx11::string::string(local_48,&local_e5,&local_e6);
      _Var2._M_i = binlog::Session::addEventSource(this,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      f::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         f::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar1 = binlog::default_thread_local_writer();
    clock = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<>
              (pSVar1,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r);
  }
  return 0;
}

Assistant:

int f()
{
  BINLOG_ERROR("Unexpected call to f()");
  return 0;
}